

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O1

void helicsFilterSetOption(HelicsFilter filt,int option,int value,HelicsError *err)

{
  HelicsFilter pvVar1;
  bool bVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (filt == (HelicsFilter)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001b2af5;
    }
    else {
      bVar2 = *(int *)((long)filt + 4) == -0x13d9fed9;
      pvVar1 = (HelicsFilter)0x0;
      if (bVar2) {
        pvVar1 = filt;
      }
      if (bVar2 || err == (HelicsError *)0x0) goto LAB_001b2af7;
    }
    err->error_code = -3;
    err->message = "The given filter object is not valid";
  }
LAB_001b2af5:
  pvVar1 = (HelicsFilter)0x0;
LAB_001b2af7:
  if (pvVar1 != (HelicsFilter)0x0) {
    (**(code **)(**(long **)((long)pvVar1 + 8) + 0x10))();
  }
  return;
}

Assistant:

void helicsFilterSetOption(HelicsFilter filt, int option, int value, HelicsError* err)
{
    auto* filtObj = getFilterObj(filt, err);
    if (filtObj == nullptr) {
        return;
    }
    try {
        filtObj->filtPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}